

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_compile(unqlite *pDb,char *zJx9,int nByte,unqlite_vm **ppOut)

{
  int local_3c;
  jx9_vm *pjStack_38;
  int rc;
  jx9_vm *pVm;
  unqlite_vm **ppOut_local;
  char *pcStack_20;
  int nByte_local;
  char *zJx9_local;
  unqlite *pDb_local;
  
  if (((pDb == (unqlite *)0x0) || (pDb->nMagic != 0xdb7c2712)) || (ppOut == (unqlite_vm **)0x0)) {
    pDb_local._4_4_ = -0x18;
  }
  else {
    pVm = (jx9_vm *)ppOut;
    ppOut_local._4_4_ = nByte;
    pcStack_20 = zJx9;
    zJx9_local = (char *)pDb;
    local_3c = jx9_compile((pDb->sDB).pJx9,zJx9,nByte,&stack0xffffffffffffffc8);
    if ((local_3c == 0) &&
       (local_3c = unqliteInitVm((unqlite *)zJx9_local,pjStack_38,(unqlite_vm **)pVm), local_3c != 0
       )) {
      jx9_vm_release(pjStack_38);
    }
    pDb_local._4_4_ = local_3c;
  }
  return pDb_local._4_4_;
}

Assistant:

int unqlite_compile(unqlite *pDb,const char *zJx9,int nByte,unqlite_vm **ppOut)
{
	jx9_vm *pVm;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) || ppOut == 0){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT;
	 }
#endif
	 /* Compile the Jx9 script first */
	 rc = jx9_compile(pDb->sDB.pJx9,zJx9,nByte,&pVm);
	 if( rc == JX9_OK ){
		 /* Allocate a new unqlite VM instance */
		 rc = unqliteInitVm(pDb,pVm,ppOut);
		 if( rc != UNQLITE_OK ){
			 /* Release the Jx9 VM */
			 jx9_vm_release(pVm);
		 }
	 }
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}